

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O2

int mmdelm_(int *mdnode,int *xadj,int *adjncy,int *dhead,int *dforw,int *dbakw,int *qsize,int *llist
           ,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  piVar6 = dforw + -1;
  marker[(long)*mdnode + -1] = *tag;
  iVar9 = xadj[(long)*mdnode + -1];
  iVar1 = xadj[*mdnode];
  iVar10 = iVar1 + -1;
  uVar11 = 0;
  for (lVar8 = (long)iVar9; lVar8 < iVar1; lVar8 = lVar8 + 1) {
    uVar7 = adjncy[lVar8 + -1];
    lVar3 = (long)(int)uVar7;
    if (lVar3 == 0) break;
    if (marker[lVar3 + -1] < *tag) {
      marker[lVar3 + -1] = *tag;
      if (piVar6[lVar3] < 0) {
        llist[lVar3 + -1] = uVar11;
        uVar11 = uVar7;
      }
      else {
        adjncy[(long)iVar9 + -1] = uVar7;
        iVar9 = iVar9 + 1;
      }
    }
  }
LAB_001405f7:
  if ((int)uVar11 < 1) {
    if (iVar9 <= iVar10) {
      adjncy[(long)iVar9 + -1] = 0;
    }
    iVar9 = *mdnode;
    do {
      lVar8 = (long)xadj[(long)iVar9 + -1];
      iVar1 = xadj[iVar9];
      while( true ) {
        if (iVar1 <= lVar8) {
          return 0;
        }
        iVar9 = adjncy[lVar8 + -1];
        lVar3 = (long)iVar9;
        if (lVar3 < 0) break;
        if (iVar9 == 0) {
          return 0;
        }
        uVar11 = dbakw[lVar3 + -1];
        if ((uVar11 != 0) && (*maxint + uVar11 != 0)) {
          iVar9 = piVar6[lVar3];
          if (0 < (long)iVar9) {
            dbakw[(long)iVar9 + -1] = uVar11;
          }
          uVar7 = -uVar11;
          if (0 < (int)uVar11) {
            uVar7 = uVar11;
          }
          piVar4 = dhead + -1;
          if (0 < (int)uVar11) {
            piVar4 = piVar6;
          }
          piVar4[uVar7] = iVar9;
        }
        iVar9 = xadj[lVar3 + -1];
        iVar10 = xadj[lVar3];
        iVar12 = iVar9;
        for (lVar5 = (long)iVar9; lVar5 < iVar10; lVar5 = lVar5 + 1) {
          iVar2 = adjncy[lVar5 + -1];
          if ((long)iVar2 == 0) break;
          if (marker[(long)iVar2 + -1] < *tag) {
            adjncy[(long)iVar12 + -1] = iVar2;
            iVar12 = iVar12 + 1;
          }
        }
        if (iVar12 - iVar9 == 0 || iVar12 < iVar9) {
          qsize[(long)*mdnode + -1] = qsize[(long)*mdnode + -1] + qsize[lVar3 + -1];
          qsize[lVar3 + -1] = 0;
          marker[lVar3 + -1] = *maxint;
          piVar6[lVar3] = -*mdnode;
          dbakw[lVar3 + -1] = -*maxint;
        }
        else {
          piVar6[lVar3] = (iVar12 - iVar9) + 1;
          dbakw[lVar3 + -1] = 0;
          adjncy[(long)iVar12 + -1] = *mdnode;
          if (iVar12 < iVar10 + -1) {
            adjncy[iVar12] = 0;
          }
        }
        lVar8 = lVar8 + 1;
      }
      iVar9 = -iVar9;
    } while( true );
  }
  adjncy[(long)iVar10 + -1] = -uVar11;
  uVar7 = uVar11;
LAB_00140576:
  lVar8 = (long)xadj[(long)(int)uVar7 + -1];
  iVar1 = xadj[(int)uVar7];
  do {
    if (iVar1 <= lVar8) {
LAB_001405ef:
      uVar11 = llist[(ulong)uVar11 - 1];
      goto LAB_001405f7;
    }
    iVar12 = adjncy[lVar8 + -1];
    lVar3 = (long)iVar12;
    if (lVar3 < 0) break;
    if (iVar12 == 0) goto LAB_001405ef;
    if ((marker[lVar3 + -1] < *tag) && (-1 < piVar6[lVar3])) {
      marker[lVar3 + -1] = *tag;
      for (; iVar10 <= iVar9; iVar10 = xadj[(long)(1 - adjncy[(long)iVar10 + -1]) + -1] + -1) {
        iVar9 = xadj[-1 - (long)adjncy[(long)iVar10 + -1]];
      }
      adjncy[(long)iVar9 + -1] = iVar12;
      iVar9 = iVar9 + 1;
    }
    lVar8 = lVar8 + 1;
  } while( true );
  uVar7 = -iVar12;
  goto LAB_00140576;
}

Assistant:

int mmdelm_(int* mdnode, int* xadj, int* adjncy, int* dhead, int* dforw,
            int* dbakw, int* qsize, int* llist, int* marker,
            int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, link, rloc, rlmt, i, j, nabor, rnode, elmnt, xqnbr,
            istop, jstop, istrt, jstrt, nxnode, pvnode, nqnbrs, npv;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

/*        ----------------------------------------------- */
/*        FIND REACHABLE SET AND PLACE IN DATA STRUCTURE. */
/*        ----------------------------------------------- */
    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    marker[*mdnode] = *tag;
    istrt = xadj[*mdnode];
    istop = xadj[*mdnode + 1] - 1;
/*        ------------------------------------------------------- */
/*        ELMNT POINTS TO THE BEGINNING OF THE LIST OF ELIMINATED */
/*        NABORS OF MDNODE, AND RLOC GIVES THE STORAGE LOCATION */
/*        FOR THE NEXT REACHABLE NODE. */
/*        ------------------------------------------------------- */
    elmnt = 0;
    rloc = istrt;
    rlmt = istop;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L300;
        }
        if (marker[nabor] >= *tag) {
            goto L200;
        }
        marker[nabor] = *tag;
        if (dforw[nabor] < 0) {
            goto L100;
        }
        adjncy[rloc] = nabor;
        ++rloc;
        goto L200;
L100:
        llist[nabor] = elmnt;
        elmnt = nabor;
L200:
        ;
    }
L300:
/*            ----------------------------------------------------- */
/*            MERGE WITH REACHABLE NODES FROM GENERALIZED ELEMENTS. */
/*            ----------------------------------------------------- */
    if (elmnt <= 0) {
        goto L1000;
    }
    adjncy[rlmt] = -elmnt;
    link = elmnt;
L400:
    jstrt = xadj[link];
    jstop = xadj[link + 1] - 1;
    i__1 = jstop;
    for (j = jstrt; j <= i__1; ++j) {
        node = adjncy[j];
        link = -node;
        if (node < 0) {
            goto L400;
        } else if (node == 0) {
            goto L900;
        } else {
            goto L500;
        }
L500:
        if (marker[node] >= *tag || dforw[node] < 0) {
            goto L800;
        }
        marker[node] = *tag;
/*                            --------------------------------- */
/*                            USE STORAGE FROM ELIMINATED NODES */
/*                            IF NECESSARY. */
/*                            --------------------------------- */
L600:
        if (rloc < rlmt) {
            goto L700;
        }
        link = -adjncy[rlmt];
        rloc = xadj[link];
        rlmt = xadj[link + 1] - 1;
        goto L600;
L700:
        adjncy[rloc] = node;
        ++rloc;
L800:
        ;
    }
L900:
    elmnt = llist[elmnt];
    goto L300;
L1000:
    if (rloc <= rlmt) {
        adjncy[rloc] = 0;
    }
/*        -------------------------------------------------------- */
/*        FOR EACH NODE IN THE REACHABLE SET, DO THE FOLLOWING ... */
/*        -------------------------------------------------------- */
    link = *mdnode;
L1100:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        rnode = adjncy[i];
        link = -rnode;
        if (rnode < 0) {
            goto L1100;
        } else if (rnode == 0) {
            goto L1800;
        } else {
            goto L1200;
        }
L1200:
/*                -------------------------------------------- */
/*                IF RNODE IS IN THE DEGREE LIST STRUCTURE ... */
/*                -------------------------------------------- */
        pvnode = dbakw[rnode];
        if (pvnode == 0 || pvnode == -(*maxint)) {
            goto L1300;
        }
/*                    ------------------------------------- */
/*                    THEN REMOVE RNODE FROM THE STRUCTURE. */
/*                    ------------------------------------- */
        nxnode = dforw[rnode];
        if (nxnode > 0) {
            dbakw[nxnode] = pvnode;
        }
        if (pvnode > 0) {
            dforw[pvnode] = nxnode;
        }
        npv = -pvnode;
        if (pvnode < 0) {
            dhead[npv] = nxnode;
        }
L1300:
/*                ---------------------------------------- */
/*                PURGE INACTIVE QUOTIENT NABORS OF RNODE. */
/*                ---------------------------------------- */
        jstrt = xadj[rnode];
        jstop = xadj[rnode + 1] - 1;
        xqnbr = jstrt;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            nabor = adjncy[j];
            if (nabor == 0) {
                goto L1500;
            }
            if (marker[nabor] >= *tag) {
                goto L1400;
            }
            adjncy[xqnbr] = nabor;
            ++xqnbr;
L1400:
            ;
        }
L1500:
/*                ---------------------------------------- */
/*                IF NO ACTIVE NABOR AFTER THE PURGING ... */
/*                ---------------------------------------- */
        nqnbrs = xqnbr - jstrt;
        if (nqnbrs > 0) {
            goto L1600;
        }
/*                    ----------------------------- */
/*                    THEN MERGE RNODE WITH MDNODE. */
/*                    ----------------------------- */
        qsize[*mdnode] += qsize[rnode];
        qsize[rnode] = 0;
        marker[rnode] = *maxint;
        dforw[rnode] = -(*mdnode);
        dbakw[rnode] = -(*maxint);
        goto L1700;
L1600:
/*                -------------------------------------- */
/*                ELSE FLAG RNODE FOR DEGREE UPDATE, AND */
/*                ADD MDNODE AS A NABOR OF RNODE. */
/*                -------------------------------------- */
        dforw[rnode] = nqnbrs + 1;
        dbakw[rnode] = 0;
        adjncy[xqnbr] = *mdnode;
        ++xqnbr;
        if (xqnbr <= jstop) {
            adjncy[xqnbr] = 0;
        }

L1700:
        ;
    }
L1800:
    return 0;

}